

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::cursor_event(Application *this,float x,float y)

{
  float y_local;
  float x_local;
  Application *this_local;
  
  if ((((this->leftDown & 1U) == 0) || ((this->middleDown & 1U) != 0)) ||
     ((this->rightDown & 1U) != 0)) {
    if ((((this->leftDown & 1U) == 0) && ((this->middleDown & 1U) == 0)) &&
       ((this->rightDown & 1U) != 0)) {
      mouse2_dragged(this,x,y);
    }
    else if ((((this->leftDown & 1U) == 0) && ((this->middleDown & 1U) == 0)) &&
            ((this->rightDown & 1U) == 0)) {
      mouse_moved(this,x,y);
    }
  }
  else {
    mouse1_dragged(this,x,y);
  }
  this->mouseX = x;
  this->mouseY = y;
  return;
}

Assistant:

void Application::cursor_event( float x, float y )
{
   if (leftDown && !middleDown && !rightDown) {
      mouse1_dragged(x, y);
   } else if (!leftDown && !middleDown && rightDown) {
      mouse2_dragged(x, y);
   } else if (!leftDown && !middleDown && !rightDown) {
      mouse_moved(x, y);
   }

   mouseX = x;
   mouseY = y;
}